

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

string * QStringConverterICU::nul_terminate_abi_cxx11_(QAnyStringView name)

{
  long lVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAnyStringView::
  visit<QStringConverterICU::nul_terminate[abi:cxx11](QAnyStringView)::_lambda(auto:1)_1_>
            ((QAnyStringView *)name.m_size,(anon_class_1_0_00000001 *)name.field_0.m_data_utf8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string nul_terminate(QAnyStringView name)
    { return name.visit([](auto name) { return nul_terminate_impl(name); }); }